

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreeVerifyConnections(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vBoxes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int i;
  
  p_00 = Vec_IntStartFull(p->nObjs);
  for (iVar9 = 0; iVar11 = vBoxes->nSize, iVar9 < iVar11; iVar9 = iVar9 + 1) {
    pVVar6 = Vec_WecEntry(vBoxes,iVar9);
    for (iVar11 = 0; iVar11 < pVVar6->nSize; iVar11 = iVar11 + 1) {
      iVar1 = Vec_IntEntry(pVVar6,iVar11);
      iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
      Vec_IntWriteEntry(p_00,iVar2,0);
      iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
      Vec_IntWriteEntry(p_00,iVar1,0);
    }
  }
  iVar9 = 0;
  do {
    if (iVar11 <= iVar9) {
      uVar4 = Vec_IntCountLarger(p_00,-1);
      printf("The adder tree has %d internal cut points. ",(ulong)uVar4);
      uVar4 = Vec_IntCountLarger(p_00,1);
      if (uVar4 == 0) {
        puts("There is no internal fanouts.");
      }
      else {
        printf("These %d points have more than one fanout:\n",(ulong)uVar4);
        uVar12 = (ulong)(uint)p_00->nSize;
        if (p_00->nSize < 1) {
          uVar12 = 0;
        }
        uVar10 = 0;
        while (uVar10 != uVar12) {
          uVar4 = Vec_IntEntry(p_00,(int)uVar10);
          if ((int)uVar4 < 2) {
            uVar10 = uVar10 + 1;
          }
          else {
            pVVar6 = p->vLevels;
            lVar7 = (long)pVVar6->nSize;
            if (lVar7 <= (long)uVar10) {
              lVar8 = (long)pVVar6->nCap;
              iVar11 = (int)(uVar10 + 1);
              iVar9 = iVar11;
              if ((SBORROW8(uVar10,lVar8 * 2) == (long)(uVar10 + lVar8 * -2) < 0) ||
                 (iVar9 = (int)(lVar8 * 2), lVar8 <= (long)uVar10)) {
                Vec_IntGrow(pVVar6,iVar9);
                lVar7 = (long)pVVar6->nSize;
              }
              for (; lVar7 <= (long)uVar10; lVar7 = lVar7 + 1) {
                pVVar6->pArray[lVar7] = 0;
              }
              pVVar6->nSize = iVar11;
            }
            uVar5 = Vec_IntEntry(pVVar6,(int)uVar10);
            printf("Node %d(lev %d) has fanout %d.\n",uVar10 & 0xffffffff,(ulong)uVar5,(ulong)uVar4)
            ;
            uVar10 = uVar10 + 1;
          }
        }
      }
      Vec_IntFree(p_00);
      return;
    }
    pVVar6 = Vec_WecEntry(vBoxes,iVar9);
    for (iVar11 = 0; iVar11 < pVVar6->nSize; iVar11 = iVar11 + 1) {
      iVar1 = Vec_IntEntry(pVVar6,iVar11);
      for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
        i = iVar1 * 6 + iVar2;
        iVar3 = Vec_IntEntry(vAdds,i);
        iVar3 = Vec_IntEntry(p_00,iVar3);
        if (iVar3 != -1) {
          uVar4 = Vec_IntEntry(vAdds,i);
          if (((int)uVar4 < 0) || (p_00->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          p_00->pArray[uVar4] = p_00->pArray[uVar4] + 1;
        }
      }
    }
    iVar9 = iVar9 + 1;
    iVar11 = vBoxes->nSize;
  } while( true );
}

Assistant:

void Acec_TreeVerifyConnections( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes )
{
    Vec_Int_t * vCounts = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, n, Box;
    // mark outputs
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
        {
            Vec_IntWriteEntry( vCounts, Vec_IntEntry( vAdds, 6*Box+3 ), 0 );
            Vec_IntWriteEntry( vCounts, Vec_IntEntry( vAdds, 6*Box+4 ), 0 );
        }
    // count fanouts
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            for ( n = 0; n < 3; n++ )
                if ( Vec_IntEntry( vCounts, Vec_IntEntry(vAdds, 6*Box+n) ) != -1 )
                    Vec_IntAddToEntry( vCounts, Vec_IntEntry(vAdds, 6*Box+n), 1 );
    // print out
    printf( "The adder tree has %d internal cut points. ", Vec_IntCountLarger(vCounts, -1) );
    if ( Vec_IntCountLarger(vCounts, 1) == 0 )
        printf( "There is no internal fanouts.\n" );
    else
    {
        printf( "These %d points have more than one fanout:\n", Vec_IntCountLarger(vCounts, 1) );
        Vec_IntForEachEntry( vCounts, Box, i )
            if ( Box > 1 )
                printf( "Node %d(lev %d) has fanout %d.\n", i, Gia_ObjLevelId(p, i), Box );
    }
    Vec_IntFree( vCounts );
}